

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleConsensusProblem.hpp
# Opt level: O2

int __thiscall
opengv::sac::SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::countWithinDistance
          (SampleConsensusProblem<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *this,
          model_t *model_coefficients,double threshold)

{
  element_type *peVar1;
  size_t i;
  long lVar2;
  int iVar3;
  vector<double,_std::allocator<double>_> dist;
  _Vector_base<double,_std::allocator<double>_> local_38;
  double local_18;
  
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  peVar1 = (this->indices_).
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_18 = threshold;
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)&local_38,
             (long)(peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  (*this->_vptr_SampleConsensusProblem[8])(this,model_coefficients,&local_38);
  iVar3 = 0;
  for (lVar2 = 0;
      (long)local_38._M_impl.super__Vector_impl_data._M_finish -
      (long)local_38._M_impl.super__Vector_impl_data._M_start >> 3 != lVar2; lVar2 = lVar2 + 1) {
    iVar3 = iVar3 + (uint)(local_38._M_impl.super__Vector_impl_data._M_start[lVar2] < local_18);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_38);
  return iVar3;
}

Assistant:

int
opengv::sac::SampleConsensusProblem<M>::countWithinDistance(
    const model_t & model_coefficients, const double threshold)
{
  std::vector<double> dist;
  dist.reserve(indices_->size());
  getDistancesToModel( model_coefficients, dist );

  int count = 0;
  for( size_t i = 0; i < dist.size(); ++i )
  {
    if( dist[i] < threshold )
      ++count;
  }

  return count;
}